

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.c
# Opt level: O0

int do_look(boolean quick)

{
  obj *poVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  nh_menuitem *pnVar5;
  char *line;
  bool local_8a1;
  bool local_891;
  byte local_881;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  int selected [1];
  int n;
  menulist menu;
  obj *otmp;
  nh_desc_buf descbuf;
  boolean from_screen;
  boolean save_verbose;
  coord cc;
  int found;
  int objplur;
  int ans;
  int i;
  char firstmatch [256];
  char out_str [256];
  boolean quick_local;
  
  if (quick == '\0') {
    cVar2 = yn_function("Specify unknown object by cursor?","ynq",'q');
    if (cVar2 == 'q') {
      return 0;
    }
    descbuf.effectdesc[0xfc] = cVar2 == 'y';
  }
  else {
    descbuf.effectdesc[0xfc] = '\x01';
  }
  if (descbuf.effectdesc[0xfc] == '\0') {
    getlin("Specify what? (type the word)",firstmatch + 0xf8);
    if ((firstmatch[0xf8] != '\0') && (firstmatch[0xf8] != '\x1b')) {
      checkfile(firstmatch + 0xf8,(permonst *)0x0,'\x01','\x01');
    }
  }
  else {
    descbuf.effectdesc[0xfe] = u.ux;
    descbuf.effectdesc[0xff] = u.uy;
    descbuf.effectdesc[0xfd] = flags.verbose;
    local_881 = 0;
    if (flags.verbose != '\0') {
      local_881 = quick != '\0' ^ 0xff;
    }
    flags.verbose = local_881 & 1;
    do {
      descbuf.objcount = 0;
      firstmatch[0xf8] = '\0';
      _from_screen = 0;
      if (flags.verbose == '\0') {
        pline("Pick an object.");
      }
      else {
        pline("Please move the cursor to %s.");
      }
      iVar3 = getpos((coord *)(descbuf.effectdesc + 0xfe),'\0',"an unknown object");
      if ((iVar3 < 0) || (descbuf.effectdesc[0xfe] < '\0')) {
        flags.verbose = descbuf.effectdesc[0xfd];
        if (descbuf.effectdesc[0xfd] == '\0') {
          return 0;
        }
        line = "Done.";
        if (quick != '\0') {
          line = "Never mind.";
        }
        pline(line);
        return 0;
      }
      flags.verbose = '\0';
      nh_describe_pos((int)descbuf.effectdesc[0xfe],(int)descbuf.effectdesc[0xff],
                      (nh_desc_buf *)&otmp);
      poVar1 = level->objects[descbuf.effectdesc[0xfe]][descbuf.effectdesc[0xff]];
      if ((poVar1 != (obj *)0x0) && ((1 < poVar1->quan || (poVar1->oartifact == '\x1d')))) {
        _from_screen = 1;
      }
      init_menulist((menulist *)selected);
      firstmatch[0xf8] = '\0';
      iVar4 = append_str(firstmatch + 0xf8,descbuf.invisdesc + 0xf8,0);
      if (iVar4 != 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _selected = (nh_menuitem *)realloc(_selected,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _selected + menu.items._4_4_;
        pnVar5->id = 0x65;
        pnVar5->role = MI_NORMAL;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,descbuf.invisdesc + 0xf8);
        menu.items._4_4_ = menu.items._4_4_ + 1;
        descbuf.objcount = descbuf.objcount + 1;
        if (descbuf.objcount == 1) {
          strcpy((char *)&ans,descbuf.invisdesc + 0xf8);
        }
      }
      iVar4 = append_str(firstmatch + 0xf8,descbuf.mondesc + 0xf8,0);
      if (iVar4 != 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _selected = (nh_menuitem *)realloc(_selected,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _selected + menu.items._4_4_;
        pnVar5->id = 0x69;
        pnVar5->role = MI_NORMAL;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,descbuf.mondesc + 0xf8);
        menu.items._4_4_ = menu.items._4_4_ + 1;
        descbuf.objcount = descbuf.objcount + 1;
        if (descbuf.objcount == 1) {
          strcpy((char *)&ans,descbuf.mondesc + 0xf8);
        }
      }
      iVar4 = append_str(firstmatch + 0xf8,descbuf.objdesc + 0xf8,0);
      if (iVar4 != 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _selected = (nh_menuitem *)realloc(_selected,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _selected + menu.items._4_4_;
        pnVar5->id = 0x6d;
        pnVar5->role = MI_NORMAL;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,descbuf.objdesc + 0xf8);
        menu.items._4_4_ = menu.items._4_4_ + 1;
        descbuf.objcount = descbuf.objcount + 1;
        if (descbuf.objcount == 1) {
          strcpy((char *)&ans,descbuf.objdesc + 0xf8);
        }
      }
      iVar4 = append_str(firstmatch + 0xf8,descbuf.trapdesc + 0xf8,_from_screen);
      if (iVar4 != 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _selected = (nh_menuitem *)realloc(_selected,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _selected + menu.items._4_4_;
        pnVar5->id = 0x6f;
        pnVar5->role = MI_NORMAL;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,descbuf.trapdesc + 0xf8);
        menu.items._4_4_ = menu.items._4_4_ + 1;
        descbuf.objcount = descbuf.objcount + 1;
        if (descbuf.objcount == 1) {
          strcpy((char *)&ans,descbuf.trapdesc + 0xf8);
        }
      }
      iVar4 = append_str(firstmatch + 0xf8,descbuf.bgdesc + 0xf8,0);
      if (iVar4 != 0) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _selected = (nh_menuitem *)realloc(_selected,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _selected + menu.items._4_4_;
        pnVar5->id = 0x74;
        pnVar5->role = MI_NORMAL;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,descbuf.bgdesc + 0xf8);
        menu.items._4_4_ = menu.items._4_4_ + 1;
        descbuf.objcount = descbuf.objcount + 1;
        if (descbuf.objcount == 1) {
          strcpy((char *)&ans,descbuf.bgdesc + 0xf8);
        }
      }
      iVar4 = append_str(firstmatch + 0xf8,(char *)&otmp,0);
      if ((iVar4 != 0) && (descbuf.objcount == 0)) {
        if ((int)menu.items <= menu.items._4_4_) {
          menu.items._0_4_ = (int)menu.items << 1;
          _selected = (nh_menuitem *)realloc(_selected,(long)(int)menu.items * 0x10c);
        }
        pnVar5 = _selected + menu.items._4_4_;
        pnVar5->id = 0x62;
        pnVar5->role = MI_NORMAL;
        pnVar5->accel = '\0';
        pnVar5->group_accel = '\0';
        pnVar5->selected = '\0';
        strcpy(pnVar5->caption,(char *)&otmp);
        menu.items._4_4_ = menu.items._4_4_ + 1;
        descbuf.objcount = descbuf.objcount + 1;
        strcpy((char *)&ans,(char *)&otmp);
      }
      if (descbuf.objcount == 0) {
        pline("I\'ve never heard of such things.");
      }
      else {
        firstmatch[0xf8] = highc(firstmatch[0xf8]);
        pline("%s.");
        if ((((0 < descbuf.objcount) && (iVar3 != 1)) && (iVar3 != 2)) &&
           ((iVar3 == 3 || (quick == '\0')))) {
          if (descbuf.objcount < 2) {
            _item_._4_4_ = 1;
          }
          else {
            _item_._4_4_ = display_menu(_selected,menu.items._4_4_,"More info?",1,(int *)&_item_);
            if ((_item_._4_4_ == 1) && ((int)_item_ - 0x62U < 0x12 || (int)_item_ == 0x74)) {
              iVar3 = (*(code *)(&DAT_003808a0 +
                                *(int *)(&DAT_003808a0 + (ulong)((int)_item_ - 0x62U) * 4)))();
              return iVar3;
            }
          }
          if (_item_._4_4_ == 1) {
            local_891 = iVar3 == 3 || 1 < descbuf.objcount;
            checkfile((char *)&ans,(permonst *)0x0,1 < descbuf.objcount,local_891);
          }
        }
      }
      if (menu.items._4_4_ != 0) {
        free(_selected);
      }
      if (quick != '\0') {
        check_tutorial_farlook((int)descbuf.effectdesc[0xfe],(int)descbuf.effectdesc[0xff]);
      }
      local_8a1 = quick == '\0' && iVar3 != 2;
    } while (local_8a1);
    flags.verbose = descbuf.effectdesc[0xfd];
    if ((quick == '\0') && (descbuf.effectdesc[0xfd] != '\0')) {
      pline("Done.");
    }
  }
  return 0;
}

Assistant:

static int do_look(boolean quick)
{
    char out_str[BUFSZ];
    char firstmatch[BUFSZ];
    int i, ans = 0, objplur = 0;
    int found;		/* count of matching syms found */
    coord cc;		/* screen pos of unknown glyph */
    boolean save_verbose;	/* saved value of flags.verbose */
    boolean from_screen;	/* question from the screen */
    struct nh_desc_buf descbuf;
    struct obj *otmp;
    struct menulist menu;
    int n, selected[1];

    if (quick) {
	from_screen = TRUE;	/* yes, we want to use the cursor */
    } else {
	i = ynq("Specify unknown object by cursor?");
	if (i == 'q') return 0;
	from_screen = (i == 'y');
    }

    if (from_screen) {
	cc.x = u.ux;
	cc.y = u.uy;
    } else {
	getlin("Specify what? (type the word)", out_str);
	if (out_str[0] == '\0' || out_str[0] == '\033')
	    return 0;

	/* the ability to specify symbols is gone: it is simply impossible to
	 * know how the window port is displaying things (tiles?) and even if
	 * charaters are used it may not be possible to type them (utf8)
	 */
	
	checkfile(out_str, NULL, TRUE, TRUE);
	return 0;
    }
    /* Save the verbose flag, we change it later. */
    save_verbose = flags.verbose;
    flags.verbose = flags.verbose && !quick;
    
    /*
     * we're identifying from the screen.
     */
    do {
	/* Reset some variables. */
	found = 0;
	out_str[0] = '\0';
	objplur = 0;

	if (flags.verbose)
	    pline("Please move the cursor to %s.",
		    what_is_an_unknown_object);
	else
	    pline("Pick an object.");

	ans = getpos(&cc, FALSE, what_is_an_unknown_object);
	if (ans < 0 || cc.x < 0) {
	    flags.verbose = save_verbose;
	    if (flags.verbose)
		pline(quick ? "Never mind." : "Done.");
	    return 0;	/* done */
	}
	flags.verbose = FALSE;	/* only print long question once */

	nh_describe_pos(cc.x, cc.y, &descbuf);
	
	otmp = vobj_at(cc.x, cc.y);
	if (otmp && is_plural(otmp))
	    objplur = 1;

	init_menulist(&menu);
	out_str[0] = '\0';
	if (append_str(out_str, descbuf.effectdesc, 0)) {
	    add_menuitem(&menu, 'e', descbuf.effectdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.effectdesc);
	}
	if (append_str(out_str, descbuf.invisdesc, 0)) {
	    add_menuitem(&menu, 'i', descbuf.invisdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.invisdesc);
	}
	if (append_str(out_str, descbuf.mondesc, 0)) {
	    add_menuitem(&menu, 'm', descbuf.mondesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.mondesc);
	}
	if (append_str(out_str, descbuf.objdesc, objplur)) {
	    add_menuitem(&menu, 'o', descbuf.objdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.objdesc);
	}
	if (append_str(out_str, descbuf.trapdesc, 0)) {
	    add_menuitem(&menu, 't', descbuf.trapdesc, 0, FALSE);
	    if (++found == 1)
		strcpy (firstmatch, descbuf.trapdesc);
	}
	if (append_str(out_str, descbuf.bgdesc, 0)) {
	    if (!found) {
		add_menuitem(&menu, 'b', descbuf.bgdesc, 0, FALSE);
		found++; /* only increment found if nothing else was seen,
		so that checkfile can be called below */
		strcpy (firstmatch, descbuf.bgdesc);
	    }
	}

	/* Finally, print out our explanation. */
	if (found) {
	    out_str[0] = highc(out_str[0]);
	    pline("%s.", out_str);
	    /* check the data file for information about this thing */
	    if (found > 0 && ans != LOOK_QUICK && ans != LOOK_ONCE &&
			(ans == LOOK_VERBOSE || !quick)) {
		if (found > 1) {
		    n = display_menu(menu.items, menu.icount, "More info?",
				     PICK_ONE, selected);
		    if (n == 1) {
			switch (selected[0]) {
			case 'e': strcpy(firstmatch, descbuf.effectdesc); break;
			case 'i': strcpy(firstmatch, descbuf.invisdesc); break;
			case 'm': strcpy(firstmatch, descbuf.mondesc); break;
			case 'o': strcpy(firstmatch, descbuf.objdesc); break;
			case 't': strcpy(firstmatch, descbuf.trapdesc); break;
			case 'b': strcpy(firstmatch, descbuf.bgdesc); break;
			}
		    }
		} else {
		    n = 1;
		}
		if (n == 1) {
		    /* Fake user_typed_name here when choosing from a menu above
		     * so players get feedback for missing database entries. */
		    checkfile(firstmatch, NULL, found > 1,
			      (ans == LOOK_VERBOSE || found > 1));
		}
	    }
	} else {
	    pline("I've never heard of such things.");
	}

	if (menu.icount)
	    free(menu.items);

	if (quick) check_tutorial_farlook(cc.x, cc.y);
    } while (!quick && ans != LOOK_ONCE);

    flags.verbose = save_verbose;
    if (!quick && flags.verbose)
	pline("Done.");

    return 0;
}